

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::btranCall(HFactor *this,HVector *vector,double expected_density,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  HVectorBase<double> *in_RDX;
  long in_RSI;
  HighsTimerClock *in_RDI;
  FactorTimer factor_timer;
  bool use_indices;
  HighsTimerClock *in_stack_00000088;
  double in_stack_00000090;
  HVector *in_stack_00000098;
  HFactor *in_stack_000000a0;
  HVector *in_stack_000000a8;
  HFactor *in_stack_000000b0;
  undefined3 in_stack_ffffffffffffffdc;
  uint factor_clock;
  
  factor_clock = CONCAT13(-1 < *(int *)(in_RSI + 4),in_stack_ffffffffffffffdc);
  FactorTimer::start((FactorTimer *)in_RDX,factor_clock,in_RDI);
  btranU(in_stack_000000b0,in_stack_000000a8,(double)in_stack_000000a0,
         (HighsTimerClock *)in_stack_00000098);
  btranL(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  if ((factor_clock & 0x1000000) != 0) {
    HVectorBase<double>::reIndex(in_RDX);
  }
  FactorTimer::stop((FactorTimer *)in_RDX,factor_clock,in_RDI);
  return;
}

Assistant:

void HFactor::btranCall(HVector& vector, const double expected_density,
                        HighsTimerClock* factor_timer_clock_pointer) const {
  const bool use_indices = vector.count >= 0;
  FactorTimer factor_timer;
  factor_timer.start(FactorBtran, factor_timer_clock_pointer);
  btranU(vector, expected_density, factor_timer_clock_pointer);
  btranL(vector, expected_density, factor_timer_clock_pointer);
  // Possibly find the indices in order
  if (use_indices) vector.reIndex();
  factor_timer.stop(FactorBtran, factor_timer_clock_pointer);
}